

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::VertexToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  long lVar6;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_00;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar7;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_01;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_02;
  long lVar8;
  pointer pcVar9;
  undefined8 uVar10;
  ulong uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  size_t fv_idx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t v_idx;
  size_t num_vertices;
  unexpected_type<const_char_*> local_108;
  undefined8 local_100;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8;
  _anonymous_namespace_ *local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  long local_88 [2];
  string local_78;
  pointer local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  ulong local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  local_d8._16_8_ = (pointer)0x0;
  local_d8._24_8_ = (pointer)0x0;
  local_b8 = (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  local_b0 = this;
  local_50 = faceVertexCounts;
  local_38 = src;
  if (*(long *)this == *(long *)(this + 8)) {
    local_108.m_error = "src data is empty.";
  }
  else {
    if (src != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      uVar4 = *(long *)(this + 8) - *(long *)this;
      uVar5 = uVar4 / (ulong)src;
      if (uVar4 % (ulong)src == 0) {
        local_78.field_2._M_allocated_capacity = 0;
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        local_40 = uVar5;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,(size_type)src
                  );
        local_a8._8_8_ = 0;
        lVar6 = *(long *)stride_bytes;
        lVar8 = *(long *)(stride_bytes + 8);
        if (lVar8 != lVar6) {
          pcVar9 = (pointer)0x0;
          local_78.field_2._8_8_ = stride_bytes;
          do {
            uVar10 = local_a8._8_8_;
            uVar11 = (ulong)*(uint *)(lVar6 + local_a8._8_8_ * 4);
            uVar4 = uVar11;
            pcVar3 = pcVar9;
            if (uVar11 != 0) {
              do {
                local_58 = pcVar3;
                puVar2 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start;
                local_a8._0_8_ = pcVar9;
                if ((pointer)((long)(local_50->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2)
                    <= pcVar9) {
                  local_98._M_allocated_capacity = (size_type)local_88;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_a8 + 0x10),
                             "faeVertexIndex {} out-of-range at faceVertexCount[{}]","");
                  fmt::format<unsigned_long,unsigned_long>
                            ((string *)(local_f8 + 0x10),(fmt *)(local_a8 + 0x10),(string *)local_a8
                             ,(unsigned_long *)(local_a8 + 8),(unsigned_long *)faceVertexCounts);
LAB_00331457:
                  uVar10 = local_f8._24_8_;
                  peVar7 = (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_f8;
                  if ((expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_f8._16_8_ ==
                      (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_d8) {
                    local_f8._8_8_ = local_d8._8_8_;
                    local_f8._16_8_ = peVar7;
                  }
                  local_f8._1_7_ = local_d8._1_7_;
                  local_f8[0] = local_d8[0];
                  local_f8._24_8_ = (pointer)0x0;
                  local_d8[0] = false;
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = false;
                  ppuVar1 = &(__return_storage_ptr__->contained).
                             super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0.m_value.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
                  if ((expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_f8._16_8_ == peVar7) {
                    *ppuVar1 = (pointer)local_f8._0_8_;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->contained).
                             super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0 + 0x18) = local_f8._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->contained).
                    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)local_f8._16_8_;
                    (__return_storage_ptr__->contained).
                    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._0_8_;
                  }
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar10;
                  local_100 = 0;
                  local_f8._0_8_ = (ulong)(uint7)local_d8._1_7_ << 8;
                  local_108.m_error = (error_type)peVar7;
                  local_f8._16_8_ =
                       (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_d8;
                  if ((long *)local_98._M_allocated_capacity != local_88) {
                    operator_delete((void *)local_98._M_allocated_capacity,local_88[0] + 1);
                    peVar7 = extraout_RAX_00;
                  }
                  goto LAB_003314fa;
                }
                local_48 = (ulong)puVar2[(long)pcVar9];
                if (uVar5 <= local_48) {
                  local_98._M_allocated_capacity = (size_type)local_88;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_a8 + 0x10),
                             "faeVertexIndices[{}] {} exceeds the number of vertices {}","");
                  fmt::format<unsigned_long,unsigned_long,unsigned_long>
                            ((string *)(local_f8 + 0x10),(fmt *)(local_a8 + 0x10),(string *)local_a8
                             ,&local_48,&local_40,(unsigned_long *)faceVertexIndices);
                  goto LAB_00331457;
                }
                memcpy(local_78._M_dataplus._M_p,(void *)(local_48 * (long)src + *(long *)local_b0),
                       (size_t)src);
                ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)(local_d8 + 0x10),
                           local_d8._24_8_,local_78._M_dataplus._M_p,local_78._M_string_length);
                pcVar9 = pcVar9 + 1;
                uVar4 = uVar4 - 1;
                pcVar3 = local_58;
              } while (uVar4 != 0);
              lVar6 = *(long *)local_78.field_2._8_8_;
              lVar8 = *(long *)(local_78.field_2._8_8_ + 8);
              pcVar9 = local_58;
            }
            pcVar9 = pcVar9 + uVar11;
            local_a8._8_8_ = uVar10 + 1;
          } while ((ulong)local_a8._8_8_ < (ulong)(lVar8 - lVar6 >> 2));
        }
        peVar7 = local_b8;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_d8._16_8_;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_d8._24_8_;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_b8;
        local_d8._16_8_ = (pointer)0x0;
        local_d8._24_8_ = (pointer)0x0;
        local_b8 = (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x0;
LAB_003314fa:
        if ((long *)local_78._M_dataplus._M_p == (long *)0x0) goto LAB_00331517;
        uVar4 = local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p;
        uVar10 = local_78._M_dataplus._M_p;
      }
      else {
        local_98._M_allocated_capacity = (size_type)local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_a8 + 0x10),"src size {} must be the multiple of stride_bytes {}"
                   ,"");
        local_78._M_dataplus._M_p = (pointer)(*(long *)(local_b0 + 8) - *(long *)local_b0);
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)(local_f8 + 0x10),(fmt *)(local_a8 + 0x10),&local_78,
                   (unsigned_long *)&local_38,(unsigned_long *)faceVertexCounts);
        uVar10 = local_f8._24_8_;
        peVar7 = (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_f8;
        if ((expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_f8._16_8_ ==
            (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_d8) {
          local_f8._8_8_ = local_d8._8_8_;
          local_f8._16_8_ = peVar7;
        }
        local_f8._1_7_ = local_d8._1_7_;
        local_f8[0] = local_d8[0];
        local_f8._24_8_ = (pointer)0x0;
        local_d8[0] = false;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = false;
        ppuVar1 = &(__return_storage_ptr__->contained).
                   super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0.m_value.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar1;
        if ((expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_f8._16_8_ == peVar7) {
          *ppuVar1 = (pointer)local_f8._0_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->contained).
                   super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0 + 0x18) = local_f8._8_8_;
        }
        else {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)local_f8._16_8_;
          (__return_storage_ptr__->contained).
          super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._0_8_;
        }
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)uVar10;
        local_100 = 0;
        local_f8._0_8_ = (ulong)(uint7)local_d8._1_7_ << 8;
        local_108.m_error = (error_type)peVar7;
        local_f8._16_8_ =
             (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_d8;
        if ((long *)local_98._M_allocated_capacity == local_88) goto LAB_00331517;
        uVar4 = local_88[0] + 1;
        uVar10 = local_98._M_allocated_capacity;
      }
      operator_delete((void *)uVar10,uVar4);
      peVar7 = extraout_RAX_01;
      goto LAB_00331517;
    }
    local_108.m_error = "stride_bytes must be non-zero.";
  }
  nonstd::expected_lite::
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<const_char_*,_0>(__return_storage_ptr__,&local_108);
  peVar7 = extraout_RAX;
LAB_00331517:
  if ((pointer)local_d8._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._16_8_,(long)local_b8 - local_d8._16_8_);
    peVar7 = extraout_RAX_02;
  }
  return peVar7;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> VertexToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices) {
  std::vector<uint8_t> dst;

  if (src.empty()) {
    return nonstd::make_unexpected("src data is empty.");
  }

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes must be non-zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("src size {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  const size_t num_vertices = src.size() / stride_bytes;

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  size_t faceVertexIndexOffset{0};

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    for (size_t k = 0; k < cnt; k++) {
      size_t fv_idx = k + faceVertexIndexOffset;

      if (fv_idx >= faceVertexIndices.size()) {
        return nonstd::make_unexpected(
            fmt::format("faeVertexIndex {} out-of-range at faceVertexCount[{}]",
                        fv_idx, i));
      }

      size_t v_idx = faceVertexIndices[fv_idx];

      if (v_idx >= num_vertices) {
        return nonstd::make_unexpected(fmt::format(
            "faeVertexIndices[{}] {} exceeds the number of vertices {}", fv_idx,
            v_idx, num_vertices));
      }

      memcpy(buf.data(), src.data() + v_idx * stride_bytes, stride_bytes);
      dst.insert(dst.end(), buf.begin(), buf.end());
    }

    faceVertexIndexOffset += cnt;
  }

  return dst;
}